

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_ratio(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar7 = "node invalid";
    uVar2 = 3;
    uVar6 = 0x57b;
LAB_001886d1:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_ratio",uVar2,pcVar7);
    return uVar2;
  }
  pRVar1 = ref_node->real;
  uVar4 = (ulong)(uint)(node1 * 0xf);
  uVar5 = (ulong)(uint)(node0 * 0xf);
  dVar13 = pRVar1[uVar4] - pRVar1[uVar5];
  dVar12 = pRVar1[uVar4 + 1] - pRVar1[uVar5 + 1];
  dVar11 = pRVar1[uVar4 + 2] - pRVar1[uVar5 + 2];
  auVar8._0_8_ = SQRT(dVar11 * dVar11 + dVar13 * dVar13 + dVar12 * dVar12) * 1e+20;
  auVar8._8_8_ = dVar13;
  auVar9._8_8_ = -dVar13;
  auVar9._0_8_ = -auVar8._0_8_;
  auVar9 = maxpd(auVar8,auVar9);
  dVar14 = auVar9._0_8_;
  if (auVar9._8_8_ < dVar14) {
    dVar15 = dVar12;
    if (dVar12 <= -dVar12) {
      dVar15 = -dVar12;
    }
    if (dVar15 < dVar14) {
      dVar15 = dVar11;
      if (dVar11 <= -dVar11) {
        dVar15 = -dVar11;
      }
      if (dVar15 < dVar14) {
        if (ref_node->ratio_method != 2) {
          ref_node_metric_get(ref_node,node0,m);
          dVar14 = (m[5] * dVar11 + m[2] * dVar13 + m[4] * dVar12) * dVar11 +
                   (m[2] * dVar11 + m[0] * dVar13 + dVar12 * m[1]) * dVar13 +
                   (m[4] * dVar11 + m[1] * dVar13 + m[3] * dVar12) * dVar12;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          ref_node_metric_get(ref_node,node1,m);
          dVar11 = (m[5] * dVar11 + m[2] * dVar13 + dVar12 * m[4]) * dVar11 +
                   (m[2] * dVar11 + m[0] * dVar13 + dVar12 * m[1]) * dVar13 +
                   (m[4] * dVar11 + m[1] * dVar13 + m[3] * dVar12) * dVar12;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar12 = dVar14;
          if (dVar11 <= dVar14) {
            dVar12 = dVar11;
          }
          if ((dVar14 < 1e-12) || (dVar11 < 1e-12)) {
            *ratio = dVar12;
            return 0;
          }
          dVar13 = dVar14;
          if (dVar14 <= dVar11) {
            dVar13 = dVar11;
          }
          dVar13 = dVar12 / dVar13;
          dVar10 = dVar13 + -1.0;
          dVar15 = dVar10;
          if (dVar10 <= -dVar10) {
            dVar15 = -dVar10;
          }
          if (dVar15 < 1e-12) {
            *ratio = (dVar14 + dVar11) * 0.5;
            return 0;
          }
          dVar14 = log(dVar13);
          *ratio = (dVar12 * dVar10) / (dVar14 * dVar13);
          return 0;
        }
        *ratio = 0.0;
        dVar14 = pRVar1[uVar4];
        dVar11 = pRVar1[uVar4 + 1];
        dVar12 = pRVar1[uVar5];
        dVar13 = pRVar1[uVar5 + 1];
        dVar15 = pRVar1[uVar4 + 2];
        dVar10 = pRVar1[uVar5 + 2];
        ref_node_metric_get_log(ref_node,node0,m);
        ref_node_metric_get_log(ref_node,node1,mlog1);
        for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
          mlog[lVar3] = m[lVar3] * 0.5 + mlog1[lVar3] * 0.5;
        }
        uVar2 = ref_matrix_exp_m(mlog,&local_e8);
        if (uVar2 == 0) {
          dVar15 = dVar15 - dVar10;
          dVar11 = dVar11 - dVar13;
          dVar14 = dVar14 - dVar12;
          dVar14 = (local_c0 * dVar15 + dVar14 * local_d8 + dVar11 * local_c8) * dVar15 +
                   (local_d8 * dVar15 + local_e8 * dVar14 + dVar11 * local_e0) * dVar14 +
                   (local_c8 * dVar15 + local_e0 * dVar14 + local_d0 * dVar11) * dVar11;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          *ratio = dVar14 + *ratio;
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x56c,"ref_node_ratio_log_quadrature",(ulong)uVar2,"exp");
        pcVar7 = "ratio";
        uVar6 = 0x58f;
        goto LAB_001886d1;
      }
    }
  }
  *ratio = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio(REF_NODE ref_node, REF_INT node0,
                                  REF_INT node1, REF_DBL *ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, ratio1;
  REF_DBL r, r_min, r_max;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_ratio_log_quadrature(ref_node, node0, node1, ratio), "ratio");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  ratio0 = ref_matrix_sqrt_vt_m_v(m, direction);
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  ratio1 = ref_matrix_sqrt_vt_m_v(m, direction);

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    *ratio = MIN(ratio0, ratio1);
    return REF_SUCCESS;
  }

  r_min = MIN(ratio0, ratio1);
  r_max = MAX(ratio0, ratio1);

  r = r_min / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (ratio0 + ratio1);
    return REF_SUCCESS;
  }

  *ratio = r_min * (r - 1.0) / (r * log(r));

  return REF_SUCCESS;
}